

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Fra_Sml_t *p_00;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  pVVar4 = p->pCla->vImps;
  dVar10 = 0.0;
  if ((pVVar4 != (Vec_Int_t *)0x0) && (pVVar4->nSize != 0)) {
    p_00 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
    if (*(int *)&p_00[1].pAig != 0) {
      __assert_fail("pResult[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraImp.c"
                    ,0x281,"double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *)");
    }
    pVVar4 = p->pCla->vImps;
    if (0 < pVVar4->nSize) {
      piVar5 = pVVar4->pArray;
      lVar8 = 0;
      do {
        iVar2 = p_00->nWordsTotal;
        lVar9 = (long)p_00->nWordsPref;
        if (p_00->nWordsPref < iVar2) {
          uVar6 = piVar5[lVar8];
          do {
            puVar1 = (uint *)((long)&p_00[1].pAig + lVar9 * 4);
            *puVar1 = *puVar1 | ~*(uint *)((long)&p_00[1].pAig +
                                          lVar9 * 4 + (long)(((int)uVar6 >> 0x10) * iVar2) * 4) &
                                *(uint *)((long)&p_00[1].pAig +
                                         lVar9 * 4 + (long)(int)((uVar6 & 0xffff) * iVar2) * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 < p_00->nWordsTotal);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar4->nSize);
    }
    iVar2 = p_00->nWordsTotal;
    iVar3 = p_00->nWordsPref;
    lVar8 = (long)iVar3;
    dVar10 = 0.0;
    if (iVar3 < iVar2) {
      iVar7 = 0;
      do {
        uVar6 = *(uint *)((long)&p_00[1].pAig + lVar8 * 4);
        uVar6 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555);
        uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
        uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
        uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
        iVar7 = iVar7 + (uVar6 >> 0x10) + (uVar6 & 0xffff);
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
      dVar10 = (double)iVar7 * 100.0;
    }
    dVar10 = dVar10 / (double)((iVar2 - iVar3) * 0x20);
    Fra_SmlStop(p_00);
  }
  return dVar10;
}

Assistant:

double Fra_ImpComputeStateSpaceRatio( Fra_Man_t * p )
{
    int nSimWords = 64;
    Fra_Sml_t * pComb;
    unsigned * pResult;
    double Ratio = 0.0;
    int Left, Right, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return Ratio;
    // simulate the AIG manager with combinational patterns
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    // go through the implications and collect where they do not hold
    pResult = Fra_ObjSim( pComb, 0 );
    assert( pResult[0] == 0 );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Sml_NodeSaveNotImpPatterns( pComb, Left, Right, pResult );
    }
    // count the number of ones in this area
    Ratio = 100.0 * Fra_SmlCountOnesOne( pComb, 0 ) / (32*(pComb->nWordsTotal-pComb->nWordsPref));
    Fra_SmlStop( pComb );
    return Ratio;
}